

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceOptions::Clear(ServiceOptions *this)

{
  internal::ExtensionSet::Clear(&this->_extensions_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
  this->deprecated_ = false;
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void ServiceOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.ServiceOptions)
  _extensions_.Clear();
  uninterpreted_option_.Clear();
  deprecated_ = false;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}